

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int SafeDecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s)

{
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  byte *pbVar6;
  uint32_t uVar7;
  int iVar8;
  size_t sVar9;
  uint32_t uVar10;
  HuffmanCode *pHVar11;
  HuffmanCode *pHVar12;
  ulong uVar13;
  HuffmanCode *table;
  uint64_t uVar14;
  uint uVar15;
  BrotliBitReader *br;
  bool bVar16;
  uint32_t block_type;
  uint32_t index;
  uint local_48;
  uint local_44;
  ulong local_40;
  uint8_t *local_38;
  
  uVar3 = s->num_block_types[0];
  if (uVar3 < 2) {
    return 0;
  }
  br = &s->br;
  uVar5 = (s->br).val_;
  uVar4 = (s->br).bit_pos_;
  local_38 = (s->br).next_in;
  local_40 = (s->br).avail_in;
  bVar16 = uVar4 - 0x32 < 0xf;
  uVar10 = uVar4;
  if (bVar16) {
    sVar9 = (s->br).avail_in;
    uVar13 = local_40;
    if (sVar9 != 0) {
      uVar14 = (s->br).val_;
      pbVar6 = (s->br).next_in;
      uVar7 = uVar4;
      do {
        uVar10 = uVar7 - 8;
        sVar9 = sVar9 - 1;
        uVar13 = uVar14 >> 8;
        (s->br).val_ = uVar13;
        uVar14 = (ulong)*pbVar6 << 0x38 | uVar14 >> 8;
        (s->br).val_ = uVar14;
        (s->br).bit_pos_ = uVar10;
        (s->br).avail_in = sVar9;
        (s->br).next_in = pbVar6 + 1;
        bVar16 = uVar7 - 0x3a < 0xf;
        if (!bVar16) goto LAB_001063aa;
        pbVar6 = pbVar6 + 1;
        uVar7 = uVar10;
      } while (sVar9 != 0);
    }
  }
  else {
LAB_001063aa:
    uVar13 = (ulong)((uint)(br->val_ >> ((byte)uVar10 & 0x3f)) & 0x7fff);
  }
  table = s->block_type_trees;
  pHVar12 = s->block_len_trees;
  if (bVar16) {
    iVar8 = SafeDecodeSymbol(table,br,&local_48);
    if (iVar8 == 0) {
      return 0;
    }
  }
  else {
    pHVar11 = table + (uVar13 & 0xff);
    bVar2 = pHVar11->bits;
    if (8 < bVar2) {
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 + 8;
      pHVar11 = pHVar11 + (ulong)pHVar11->value +
                          (ulong)((uint)(uVar13 >> 8) & 0xffffff & kBitMask[bVar2 - 8]);
    }
    puVar1 = &(s->br).bit_pos_;
    *puVar1 = *puVar1 + (uint)pHVar11->bits;
    local_48 = (uint)pHVar11->value;
  }
  if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
    uVar10 = (s->br).bit_pos_;
    bVar16 = uVar10 - 0x32 < 0xf;
    if (bVar16) {
      sVar9 = (s->br).avail_in;
      if (sVar9 != 0) {
        uVar14 = (s->br).val_;
        pbVar6 = (s->br).next_in;
        uVar7 = uVar10;
        do {
          uVar10 = uVar7 - 8;
          sVar9 = sVar9 - 1;
          table = (HuffmanCode *)(uVar14 >> 8);
          (s->br).val_ = (uint64_t)table;
          uVar14 = (ulong)*pbVar6 << 0x38 | uVar14 >> 8;
          (s->br).val_ = uVar14;
          (s->br).bit_pos_ = uVar10;
          (s->br).avail_in = sVar9;
          (s->br).next_in = pbVar6 + 1;
          bVar16 = uVar7 - 0x3a < 0xf;
          if (!bVar16) goto LAB_0010648c;
          pbVar6 = pbVar6 + 1;
          uVar7 = uVar10;
        } while (sVar9 != 0);
      }
    }
    else {
LAB_0010648c:
      table = (HuffmanCode *)(ulong)((uint)(br->val_ >> ((byte)uVar10 & 0x3f)) & 0x7fff);
    }
    if (bVar16) {
      iVar8 = SafeDecodeSymbol(pHVar12,br,&local_44);
      if (iVar8 == 0) goto LAB_001065b2;
    }
    else {
      pHVar12 = pHVar12 + ((ulong)table & 0xff);
      bVar2 = pHVar12->bits;
      if (8 < bVar2) {
        puVar1 = &(s->br).bit_pos_;
        *puVar1 = *puVar1 + 8;
        pHVar12 = pHVar12 + (ulong)pHVar12->value +
                            (ulong)((uint)((ulong)table >> 8) & 0xffffff & kBitMask[bVar2 - 8]);
      }
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 + (uint)pHVar12->bits;
      local_44 = (uint)pHVar12->value;
    }
  }
  else {
    local_44 = s->block_length_index;
  }
  bVar2 = kBlockLengthPrefixCode[local_44].nbits;
  uVar10 = (s->br).bit_pos_;
  bVar16 = 0x40 - uVar10 < (uint)bVar2;
  if (bVar16) {
    sVar9 = (s->br).avail_in;
    if (sVar9 != 0) {
      uVar14 = (s->br).val_;
      uVar15 = 0x48 - uVar10;
      pbVar6 = (s->br).next_in;
      do {
        uVar10 = uVar10 - 8;
        sVar9 = sVar9 - 1;
        (s->br).val_ = uVar14 >> 8;
        uVar14 = (ulong)*pbVar6 << 0x38 | uVar14 >> 8;
        (s->br).val_ = uVar14;
        (s->br).bit_pos_ = uVar10;
        (s->br).avail_in = sVar9;
        (s->br).next_in = pbVar6 + 1;
        bVar16 = uVar15 < bVar2;
        if (!bVar16) goto LAB_00106569;
        uVar15 = uVar15 + 8;
        pbVar6 = pbVar6 + 1;
      } while (sVar9 != 0);
    }
  }
  else {
LAB_00106569:
    br = (BrotliBitReader *)
         (ulong)((uint)((s->br).val_ >> ((byte)uVar10 & 0x3f)) & kBitMask[(uint)bVar2]);
    (s->br).bit_pos_ = uVar10 + bVar2;
  }
  if (!bVar16) {
    s->block_length[0] = (int)br + (uint)kBlockLengthPrefixCode[local_44].offset;
  }
  else {
    s->block_length_index = local_44;
  }
  s->substate_read_block_length = (uint)bVar16;
  if (!bVar16) {
    if (local_48 == 0) {
      local_48 = s->block_type_rb[0];
    }
    else if (local_48 == 1) {
      local_48 = s->block_type_rb[1] + 1;
    }
    else {
      local_48 = local_48 - 2;
    }
    if (uVar3 <= local_48) {
      local_48 = local_48 - uVar3;
    }
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = local_48;
    s->context_map_slice = s->context_map + (local_48 << 6);
    s->trivial_literal_context =
         (uint)((s->trivial_literal_contexts[local_48 >> 5] >> (local_48 & 0x1f) & 1) != 0);
    s->literal_htree = (s->literal_hgroup).htrees[s->context_map[local_48 << 6]];
    s->context_lookup = "" + ((s->context_modes[local_48] & 3) << 9);
    return 1;
  }
LAB_001065b2:
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
  (s->br).val_ = uVar5;
  (s->br).bit_pos_ = uVar4;
  (s->br).next_in = local_38;
  (s->br).avail_in = local_40;
  return 0;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}